

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

char * ssh2_pkt_type(Pkt_KCtx pkt_kctx,Pkt_ACtx pkt_actx,int type)

{
  int type_local;
  Pkt_ACtx pkt_actx_local;
  Pkt_KCtx pkt_kctx_local;
  
  if (type == 1) {
    _pkt_actx_local = "SSH2_MSG_DISCONNECT";
  }
  else if (type == 2) {
    _pkt_actx_local = "SSH2_MSG_IGNORE";
  }
  else if (type == 3) {
    _pkt_actx_local = "SSH2_MSG_UNIMPLEMENTED";
  }
  else if (type == 4) {
    _pkt_actx_local = "SSH2_MSG_DEBUG";
  }
  else if (type == 5) {
    _pkt_actx_local = "SSH2_MSG_SERVICE_REQUEST";
  }
  else if (type == 6) {
    _pkt_actx_local = "SSH2_MSG_SERVICE_ACCEPT";
  }
  else if (type == 7) {
    _pkt_actx_local = "SSH2_MSG_EXT_INFO";
  }
  else if (type == 0x14) {
    _pkt_actx_local = "SSH2_MSG_KEXINIT";
  }
  else if (type == 0x15) {
    _pkt_actx_local = "SSH2_MSG_NEWKEYS";
  }
  else if ((type == 0x1e) && (pkt_kctx == SSH2_PKTCTX_DHGROUP)) {
    _pkt_actx_local = "SSH2_MSG_KEXDH_INIT";
  }
  else if ((type == 0x1f) && (pkt_kctx == SSH2_PKTCTX_DHGROUP)) {
    _pkt_actx_local = "SSH2_MSG_KEXDH_REPLY";
  }
  else if ((type == 0x1e) && (pkt_kctx == SSH2_PKTCTX_DHGEX)) {
    _pkt_actx_local = "SSH2_MSG_KEX_DH_GEX_REQUEST_OLD";
  }
  else if ((type == 0x22) && (pkt_kctx == SSH2_PKTCTX_DHGEX)) {
    _pkt_actx_local = "SSH2_MSG_KEX_DH_GEX_REQUEST";
  }
  else if ((type == 0x1f) && (pkt_kctx == SSH2_PKTCTX_DHGEX)) {
    _pkt_actx_local = "SSH2_MSG_KEX_DH_GEX_GROUP";
  }
  else if ((type == 0x20) && (pkt_kctx == SSH2_PKTCTX_DHGEX)) {
    _pkt_actx_local = "SSH2_MSG_KEX_DH_GEX_INIT";
  }
  else if ((type == 0x21) && (pkt_kctx == SSH2_PKTCTX_DHGEX)) {
    _pkt_actx_local = "SSH2_MSG_KEX_DH_GEX_REPLY";
  }
  else if ((type == 0x1e) && (pkt_kctx == SSH2_PKTCTX_GSSKEX)) {
    _pkt_actx_local = "SSH2_MSG_KEXGSS_INIT";
  }
  else if ((type == 0x1f) && (pkt_kctx == SSH2_PKTCTX_GSSKEX)) {
    _pkt_actx_local = "SSH2_MSG_KEXGSS_CONTINUE";
  }
  else if ((type == 0x20) && (pkt_kctx == SSH2_PKTCTX_GSSKEX)) {
    _pkt_actx_local = "SSH2_MSG_KEXGSS_COMPLETE";
  }
  else if ((type == 0x21) && (pkt_kctx == SSH2_PKTCTX_GSSKEX)) {
    _pkt_actx_local = "SSH2_MSG_KEXGSS_HOSTKEY";
  }
  else if ((type == 0x22) && (pkt_kctx == SSH2_PKTCTX_GSSKEX)) {
    _pkt_actx_local = "SSH2_MSG_KEXGSS_ERROR";
  }
  else if ((type == 0x28) && (pkt_kctx == SSH2_PKTCTX_GSSKEX)) {
    _pkt_actx_local = "SSH2_MSG_KEXGSS_GROUPREQ";
  }
  else if ((type == 0x29) && (pkt_kctx == SSH2_PKTCTX_GSSKEX)) {
    _pkt_actx_local = "SSH2_MSG_KEXGSS_GROUP";
  }
  else if ((type == 0x1e) && (pkt_kctx == SSH2_PKTCTX_RSAKEX)) {
    _pkt_actx_local = "SSH2_MSG_KEXRSA_PUBKEY";
  }
  else if ((type == 0x1f) && (pkt_kctx == SSH2_PKTCTX_RSAKEX)) {
    _pkt_actx_local = "SSH2_MSG_KEXRSA_SECRET";
  }
  else if ((type == 0x20) && (pkt_kctx == SSH2_PKTCTX_RSAKEX)) {
    _pkt_actx_local = "SSH2_MSG_KEXRSA_DONE";
  }
  else if ((type == 0x1e) && (pkt_kctx == SSH2_PKTCTX_ECDHKEX)) {
    _pkt_actx_local = "SSH2_MSG_KEX_ECDH_INIT";
  }
  else if ((type == 0x1f) && (pkt_kctx == SSH2_PKTCTX_ECDHKEX)) {
    _pkt_actx_local = "SSH2_MSG_KEX_ECDH_REPLY";
  }
  else if (type == 0x32) {
    _pkt_actx_local = "SSH2_MSG_USERAUTH_REQUEST";
  }
  else if (type == 0x33) {
    _pkt_actx_local = "SSH2_MSG_USERAUTH_FAILURE";
  }
  else if (type == 0x34) {
    _pkt_actx_local = "SSH2_MSG_USERAUTH_SUCCESS";
  }
  else if (type == 0x35) {
    _pkt_actx_local = "SSH2_MSG_USERAUTH_BANNER";
  }
  else if ((type == 0x3c) && (pkt_actx == SSH2_PKTCTX_PUBLICKEY)) {
    _pkt_actx_local = "SSH2_MSG_USERAUTH_PK_OK";
  }
  else if ((type == 0x3c) && (pkt_actx == SSH2_PKTCTX_PASSWORD)) {
    _pkt_actx_local = "SSH2_MSG_USERAUTH_PASSWD_CHANGEREQ";
  }
  else if ((type == 0x3c) && (pkt_actx == SSH2_PKTCTX_KBDINTER)) {
    _pkt_actx_local = "SSH2_MSG_USERAUTH_INFO_REQUEST";
  }
  else if ((type == 0x3d) && (pkt_actx == SSH2_PKTCTX_KBDINTER)) {
    _pkt_actx_local = "SSH2_MSG_USERAUTH_INFO_RESPONSE";
  }
  else if ((type == 0x3c) && (pkt_actx == SSH2_PKTCTX_GSSAPI)) {
    _pkt_actx_local = "SSH2_MSG_USERAUTH_GSSAPI_RESPONSE";
  }
  else if ((type == 0x3d) && (pkt_actx == SSH2_PKTCTX_GSSAPI)) {
    _pkt_actx_local = "SSH2_MSG_USERAUTH_GSSAPI_TOKEN";
  }
  else if ((type == 0x3f) && (pkt_actx == SSH2_PKTCTX_GSSAPI)) {
    _pkt_actx_local = "SSH2_MSG_USERAUTH_GSSAPI_EXCHANGE_COMPLETE";
  }
  else if ((type == 0x40) && (pkt_actx == SSH2_PKTCTX_GSSAPI)) {
    _pkt_actx_local = "SSH2_MSG_USERAUTH_GSSAPI_ERROR";
  }
  else if ((type == 0x41) && (pkt_actx == SSH2_PKTCTX_GSSAPI)) {
    _pkt_actx_local = "SSH2_MSG_USERAUTH_GSSAPI_ERRTOK";
  }
  else if ((type == 0x42) && (pkt_actx == SSH2_PKTCTX_GSSAPI)) {
    _pkt_actx_local = "SSH2_MSG_USERAUTH_GSSAPI_MIC";
  }
  else if (type == 0x50) {
    _pkt_actx_local = "SSH2_MSG_GLOBAL_REQUEST";
  }
  else if (type == 0x51) {
    _pkt_actx_local = "SSH2_MSG_REQUEST_SUCCESS";
  }
  else if (type == 0x52) {
    _pkt_actx_local = "SSH2_MSG_REQUEST_FAILURE";
  }
  else if (type == 0x5a) {
    _pkt_actx_local = "SSH2_MSG_CHANNEL_OPEN";
  }
  else if (type == 0x5b) {
    _pkt_actx_local = "SSH2_MSG_CHANNEL_OPEN_CONFIRMATION";
  }
  else if (type == 0x5c) {
    _pkt_actx_local = "SSH2_MSG_CHANNEL_OPEN_FAILURE";
  }
  else if (type == 0x5d) {
    _pkt_actx_local = "SSH2_MSG_CHANNEL_WINDOW_ADJUST";
  }
  else if (type == 0x5e) {
    _pkt_actx_local = "SSH2_MSG_CHANNEL_DATA";
  }
  else if (type == 0x5f) {
    _pkt_actx_local = "SSH2_MSG_CHANNEL_EXTENDED_DATA";
  }
  else if (type == 0x60) {
    _pkt_actx_local = "SSH2_MSG_CHANNEL_EOF";
  }
  else if (type == 0x61) {
    _pkt_actx_local = "SSH2_MSG_CHANNEL_CLOSE";
  }
  else if (type == 0x62) {
    _pkt_actx_local = "SSH2_MSG_CHANNEL_REQUEST";
  }
  else if (type == 99) {
    _pkt_actx_local = "SSH2_MSG_CHANNEL_SUCCESS";
  }
  else if (type == 100) {
    _pkt_actx_local = "SSH2_MSG_CHANNEL_FAILURE";
  }
  else {
    _pkt_actx_local = "unknown";
  }
  return _pkt_actx_local;
}

Assistant:

const char *ssh2_pkt_type(Pkt_KCtx pkt_kctx, Pkt_ACtx pkt_actx, int type)
{
    SSH2_MESSAGE_TYPES(TRANSLATE_UNIVERSAL, TRANSLATE_KEX, TRANSLATE_AUTH, y);
    return "unknown";
}